

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O2

void __thiscall Js::SharedContents::Cleanup(SharedContents *this)

{
  int iVar1;
  IndexToWaitersMap *pIVar2;
  WaiterList *this_00;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  int iVar6;
  ulong uVar7;
  AutoCriticalSection local_38;
  AutoCriticalSection autoCS;
  
  if (this->refCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x29,"(refCount == 0)","refCount == 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  this->buffer = (BYTE *)0x0;
  this->bufferLength = 0;
  local_38.cs = &this->csAgent;
  CCLock::Enter(&(local_38.cs)->super_CCLock);
  if (this->allowedAgents !=
      (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::List<unsigned_long,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
              (&Memory::HeapAllocator::Instance,this->allowedAgents);
    this->allowedAgents = (SharableAgents *)0x0;
  }
  AutoCriticalSection::~AutoCriticalSection(&local_38);
  pIVar2 = this->indexToWaiterList;
  if (pIVar2 != (IndexToWaitersMap *)0x0) {
    for (uVar7 = 0; uVar7 < pIVar2->bucketCount; uVar7 = uVar7 + 1) {
      iVar6 = pIVar2->buckets[uVar7];
      if (pIVar2->buckets[uVar7] != -1) {
        while (iVar6 != -1) {
          iVar1 = pIVar2->entries[iVar6].
                  super_DefaultHashedEntry<unsigned_int,_Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Js::WaiterList_*>.
                  super_ValueEntry<Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>.next;
          this_00 = pIVar2->entries[iVar6].
                    super_DefaultHashedEntry<unsigned_int,_Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_int,_Js::WaiterList_*>.
                    super_ValueEntry<Js::WaiterList_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_int,_Js::WaiterList_*>.value;
          iVar6 = iVar1;
          if (this_00 != (WaiterList *)0x0) {
            WaiterList::Cleanup(this_00);
            Memory::
            DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::WaiterList>
                      (&Memory::HeapAllocator::Instance,this_00);
          }
        }
      }
    }
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseDictionary<unsigned_int,Js::WaiterList*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
              (&Memory::HeapAllocator::Instance,this->indexToWaiterList);
    this->indexToWaiterList = (IndexToWaitersMap *)0x0;
  }
  return;
}

Assistant:

void SharedContents::Cleanup()
    {
        Assert(refCount == 0);
        buffer = nullptr;
        bufferLength = 0;
#if DBG
        {
            AutoCriticalSection autoCS(&csAgent);
            if (allowedAgents != nullptr)
            {
                HeapDelete(allowedAgents);
                allowedAgents = nullptr;
            }
        }
#endif

        if (indexToWaiterList != nullptr)
        {
            // TODO: the map should be empty here?
            // or we need to wake all the waiters from current context?
            indexToWaiterList->Map([](uint index, WaiterList *waiters)
            {
                if (waiters != nullptr)
                {
                    waiters->Cleanup();
                    HeapDelete(waiters);
                    waiters = nullptr;
                }
            });

            HeapDelete(indexToWaiterList);
            indexToWaiterList = nullptr;
        }
    }